

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O1

InputFile * __thiscall
Imf_2_5::MultiPartInputFile::getInputPart<Imf_2_5::InputFile>
          (MultiPartInputFile *this,int partNumber)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  Data *this_00;
  int iVar2;
  mapped_type *ppGVar3;
  InputFile *this_01;
  InputPartData *part;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int local_34;
  pair<int,_Imf_2_5::GenericInputFile_*> local_30;
  
  __mutex = (pthread_mutex_t *)this->_data;
  local_34 = partNumber;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    this_00 = this->_data;
    p_Var1 = &(this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < local_34]
        ) {
      if (local_34 <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var5 = p_Var4, local_34 < (int)p_Var4[1]._M_color)) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      this_01 = (InputFile *)operator_new(0x10);
      part = Data::getPart(this_00,local_34);
      InputFile::InputFile(this_01,part);
      local_30.first = local_34;
      local_30.second = (GenericInputFile *)this_01;
      std::
      _Rb_tree<int,std::pair<int_const,Imf_2_5::GenericInputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericInputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
      ::_M_emplace_unique<std::pair<int,Imf_2_5::GenericInputFile*>>
                ((_Rb_tree<int,std::pair<int_const,Imf_2_5::GenericInputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericInputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
                  *)&this->_data->_inputFiles,&local_30);
    }
    else {
      ppGVar3 = std::
                map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
                ::operator[](&this_00->_inputFiles,&local_34);
      this_01 = (InputFile *)*ppGVar3;
    }
    pthread_mutex_unlock(__mutex);
    return this_01;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

T*
MultiPartInputFile::getInputPart(int partNumber)
{
    Lock lock(*_data);
            if (_data->_inputFiles.find(partNumber) == _data->_inputFiles.end())
        {
            T* file = new T(_data->getPart(partNumber));
            _data->_inputFiles.insert(std::make_pair(partNumber, (GenericInputFile*) file));
            return file;
        }
        else return (T*) _data->_inputFiles[partNumber];
}